

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O2

token * __thiscall
argo::pointer::translate_uri_token
          (token *__return_storage_ptr__,pointer *this,string *pointer,size_t *start,size_t *end)

{
  ulong index;
  char cVar1;
  size_t sVar2;
  pointer pcVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  json_pointer_exception *this_00;
  char cVar8;
  token *this_01;
  string translated;
  
  translated._M_dataplus._M_p = (pointer)&translated.field_2;
  translated._M_string_length = 0;
  translated.field_2._M_local_buf[0] = '\0';
  sVar2 = *start;
  uVar7 = sVar2 + 1;
  *start = uVar7;
  if ((pointer->_M_dataplus)._M_p[sVar2] == '/') {
    this_01 = __return_storage_ptr__;
    do {
      if (*end <= uVar7) {
        make_token(__return_storage_ptr__,this,&translated);
        std::__cxx11::string::~string((string *)&translated);
        return __return_storage_ptr__;
      }
      pcVar3 = (pointer->_M_dataplus)._M_p;
      cVar1 = pcVar3[uVar7];
      index = uVar7 + 1;
      *start = index;
      cVar8 = (char)(token *)&translated;
      if (cVar1 == '%') {
        if (*end - 1 <= index) break;
        *start = uVar7 + 2;
        iVar5 = from_hex((pointer *)this_01,pointer,index);
        sVar2 = *start;
        *start = sVar2 + 1;
        iVar6 = from_hex((pointer *)this_01,pointer,sVar2);
        this = (pointer *)(ulong)(uint)(int)(char)((byte)iVar6 | (byte)(iVar5 << 4));
        this_01 = (token *)&translated;
        std::__cxx11::string::push_back(cVar8);
      }
      else if (cVar1 == '~') {
        if (*end <= index) break;
        bVar4 = 0x2f;
        if (pcVar3[index] != '1') {
          if (pcVar3[index] != '0') break;
          bVar4 = 0x7e;
        }
        this = (pointer *)(ulong)bVar4;
        this_01 = (token *)&translated;
        std::__cxx11::string::push_back(cVar8);
        *start = *start + 1;
      }
      else {
        this = (pointer *)(ulong)(uint)(int)pcVar3[uVar7];
        this_01 = (token *)&translated;
        std::__cxx11::string::push_back(cVar8);
      }
      uVar7 = *start;
    } while( true );
  }
  this_00 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
  json_pointer_exception::json_pointer_exception
            (this_00,syntax_error_in_pointer_string_e,(int)*start + -1);
  __cxa_throw(this_00,&json_pointer_exception::typeinfo,std::exception::~exception);
}

Assistant:

pointer::token pointer::translate_uri_token(const string &pointer, size_t &start, size_t &end)
{
    string translated;

    if (pointer[start++] == '/')
    {
        while (start < end)
        {
            if (pointer[start] == '~')
            {
                if (++start < end)
                {
                    if (pointer[start] == '0')
                    {
                        translated += '~';
                    }
                    else if (pointer[start] == '1')
                    {
                        translated += '/';
                    }
                    else
                    {
                        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                    }
                    start++;
                }
                else
                {
                    throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                }
            }
            else if (pointer[start] == '%')
            {
                if (++start < (end - 1))
                {
                    int c = from_hex(pointer, start++) * 16;
                    c += from_hex(pointer, start++);
                    translated += static_cast<char>(c);
                }
                else
                {
                    throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                }
            }
            else
            {
                translated += pointer[start++];
            }
        }

        return make_token(translated);
    }
    else
    {
        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
    }
}